

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::MaybeConcatString(ParseState *this,int r,ParseFlags flags)

{
  Rune r_00;
  Regexp *this_00;
  Regexp *this_01;
  void *in_stack_00000020;
  int local_38;
  int i;
  Rune rune;
  Regexp *re2;
  Regexp *re1;
  ParseFlags flags_local;
  int r_local;
  ParseState *this_local;
  
  this_00 = this->stacktop_;
  if ((this_00 == (Regexp *)0x0) || (this_01 = this_00->down_, this_01 == (Regexp *)0x0)) {
    this_local._7_1_ = false;
  }
  else if ((this_00->op_ == '\x03') || (this_00->op_ == '\x04')) {
    if ((this_01->op_ == '\x03') || (this_01->op_ == '\x04')) {
      if ((this_00->parse_flags_ & 1) == (this_01->parse_flags_ & 1)) {
        if (this_01->op_ == '\x03') {
          r_00 = (this_01->field_7).rune_;
          this_01->op_ = '\x04';
          (this_01->field_7).field_0.max_ = 0;
          (this_01->field_7).field_1.name_ = (string *)0x0;
          AddRuneToString(this_01,r_00);
        }
        if (this_00->op_ == '\x03') {
          AddRuneToString(this_01,(this_00->field_7).rune_);
        }
        else {
          for (local_38 = 0; local_38 < (this_00->field_7).field_0.max_; local_38 = local_38 + 1) {
            AddRuneToString(this_01,*(Rune *)((long)&(((this_00->field_7).field_1.name_)->
                                                     _M_dataplus)._M_p + (long)local_38 * 4));
          }
          (this_00->field_7).field_0.max_ = 0;
          if ((this_00->field_7).field_1.name_ != (string *)0x0) {
            operator_delete__(in_stack_00000020);
          }
          (this_00->field_7).field_1.name_ = (string *)0x0;
        }
        if (r < 0) {
          this->stacktop_ = this_01;
          Decref(this_00);
          this_local._7_1_ = false;
        }
        else {
          this_00->op_ = '\x03';
          (this_00->field_7).field_0.max_ = r;
          this_00->parse_flags_ = (uint16_t)flags;
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Regexp::ParseState::MaybeConcatString(int r, ParseFlags flags) {
  Regexp* re1;
  Regexp* re2;
  if ((re1 = stacktop_) == NULL || (re2 = re1->down_) == NULL)
    return false;

  if (re1->op_ != kRegexpLiteral && re1->op_ != kRegexpLiteralString)
    return false;
  if (re2->op_ != kRegexpLiteral && re2->op_ != kRegexpLiteralString)
    return false;
  if ((re1->parse_flags_ & FoldCase) != (re2->parse_flags_ & FoldCase))
    return false;

  if (re2->op_ == kRegexpLiteral) {
    // convert into string
    Rune rune = re2->rune_;
    re2->op_ = kRegexpLiteralString;
    re2->nrunes_ = 0;
    re2->runes_ = NULL;
    re2->AddRuneToString(rune);
  }

  // push re1 into re2.
  if (re1->op_ == kRegexpLiteral) {
    re2->AddRuneToString(re1->rune_);
  } else {
    for (int i = 0; i < re1->nrunes_; i++)
      re2->AddRuneToString(re1->runes_[i]);
    re1->nrunes_ = 0;
    delete[] re1->runes_;
    re1->runes_ = NULL;
  }

  // reuse re1 if possible
  if (r >= 0) {
    re1->op_ = kRegexpLiteral;
    re1->rune_ = r;
    re1->parse_flags_ = static_cast<uint16_t>(flags);
    return true;
  }

  stacktop_ = re2;
  re1->Decref();
  return false;
}